

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void transpose32a(uint *a)

{
  ulong uVar1;
  unsigned_long t;
  unsigned_long m;
  int k;
  int j;
  uint *a_local;
  
  m._4_4_ = 0x10;
  t = 0xffff;
  while (m._4_4_ != 0) {
    for (m._0_4_ = 0; (int)(uint)m < 0x20;
        m._0_4_ = ((uint)m | m._4_4_) + 1 & (m._4_4_ ^ 0xffffffff)) {
      uVar1 = (a[(int)(uint)m] ^ a[(int)((uint)m | m._4_4_)] >> (sbyte)m._4_4_) & t;
      a[(int)(uint)m] = a[(int)(uint)m] ^ (uint)uVar1;
      a[(int)((uint)m | m._4_4_)] = a[(int)((uint)m | m._4_4_)] ^ (uint)(uVar1 << (sbyte)m._4_4_);
    }
    m._4_4_ = (int)m._4_4_ >> 1;
    t = t << (sbyte)m._4_4_ ^ t;
  }
  return;
}

Assistant:

void transpose32a( unsigned a[32] ) 
{
    int j, k;
    unsigned long m, t;
    for ( j = 16, m = 0x0000FFFF; j; j >>= 1, m ^= m << j ) 
    {
        for ( k = 0; k < 32; k = ((k | j) + 1) & ~j ) 
        {
            t = (a[k] ^ (a[k|j] >> j)) & m;
            a[k] ^= t;
            a[k|j] ^= (t << j);
        }
    }
}